

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::BasicReporter::StartGroup(BasicReporter *this,string *groupName)

{
  SpanInfo local_40;
  string *local_18;
  string *groupName_local;
  BasicReporter *this_local;
  
  local_18 = groupName;
  groupName_local = (string *)this;
  SpanInfo::SpanInfo(&local_40,groupName);
  SpanInfo::operator=(&this->m_groupSpan,&local_40);
  SpanInfo::~SpanInfo(&local_40);
  return;
}

Assistant:

virtual void StartGroup( const std::string& groupName ) {
            m_groupSpan = groupName;
        }